

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace_diag_sse2_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sw_trace_diag_sse2_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  parasail_result_t *ppVar4;
  int64_t *ptr;
  ulong *ptr_00;
  ulong *ptr_01;
  long lVar5;
  int *piVar6;
  int *piVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  int iVar11;
  int *piVar12;
  ulong uVar13;
  char *__format;
  ulong uVar15;
  int *piVar16;
  int *piVar17;
  ulong uVar18;
  uint uVar19;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Da_00;
  uint extraout_XMM0_Da_01;
  uint extraout_XMM0_Da_02;
  uint extraout_XMM0_Da_03;
  uint extraout_XMM0_Da_04;
  uint extraout_XMM0_Da_05;
  uint extraout_XMM0_Da_06;
  uint uVar21;
  undefined8 extraout_XMM0_Qa;
  uint extraout_XMM0_Db;
  undefined8 extraout_XMM0_Qa_00;
  uint extraout_XMM0_Db_00;
  ulong extraout_XMM0_Qa_01;
  uint extraout_XMM0_Db_01;
  ulong extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  byte extraout_XMM0_Bi;
  uint extraout_XMM0_Dc;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar20 [16];
  byte extraout_XMM0_Bi_00;
  byte extraout_XMM0_Bi_01;
  byte extraout_XMM0_Bi_02;
  byte extraout_XMM0_Bi_03;
  uint extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dc_01;
  uint extraout_XMM0_Dd;
  undefined8 extraout_XMM0_Qb_00;
  uint extraout_XMM0_Dd_00;
  ulong extraout_XMM0_Qb_01;
  uint extraout_XMM0_Dd_01;
  ulong extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  __m128i_64_t A;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  int iVar33;
  int iVar34;
  int iVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  uint uVar40;
  uint uVar41;
  __m128i_64_t B;
  uint uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  __m128i_64_t A_1;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i alVar46;
  __m128i alVar47;
  undefined1 local_298 [16];
  int iStack_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  int64_t *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  int *local_228;
  ulong uStack_220;
  ulong local_218;
  ulong uStack_210;
  long local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1d8;
  ulong uStack_1c0;
  undefined1 local_1b8 [16];
  int *local_1a8;
  ulong uStack_1a0;
  int *local_178;
  ulong uStack_170;
  int *local_168;
  ulong uStack_160;
  long local_150;
  int *local_148;
  long local_140;
  int *local_138;
  int *local_130;
  undefined1 local_128 [16];
  int *local_118;
  ulong uStack_110;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  int local_c8;
  undefined4 uStack_c4;
  int iStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  ulong local_58;
  ulong uStack_50;
  int *local_48;
  ulong uStack_40;
  parasail_matrix_t *ppVar14;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar9 = "_s2";
  }
  else {
    piVar16 = (int *)CONCAT44(0,s2Len);
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar9 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar9 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar9 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar9 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        uVar18 = (ulong)(uint)matrix->length;
LAB_005fe81b:
        iVar30 = matrix->min;
        uVar13 = 0x8000000000000000 - (long)iVar30;
        if (iVar30 != -open && SBORROW4(iVar30,-open) == iVar30 + open < 0) {
          uVar13 = (ulong)(uint)open | 0x8000000000000000;
        }
        iVar30 = matrix->max;
        iVar11 = (int)uVar18;
        ppVar4 = parasail_result_new_trace(iVar11,s2Len,0x10,1);
        if (ppVar4 != (parasail_result_t *)0x0) {
          ppVar4->flag = ppVar4->flag | 0x2881004;
          a[1] = (int *)(ulong)(s2Len + 2);
          ptr = parasail_memalign_int64_t(0x10,(size_t)a[1]);
          ptr_00 = (ulong *)parasail_memalign_int64_t(0x10,(size_t)a[1]);
          ptr_01 = (ulong *)parasail_memalign_int64_t(0x10,(size_t)a[1]);
          if (ptr_01 != (ulong *)0x0 && (ptr_00 != (ulong *)0x0 && ptr != (int64_t *)0x0)) {
            lVar5 = (long)iVar11;
            if (matrix->type == 0) {
              a[1] = (int *)(long)(iVar11 + 1);
              local_260 = parasail_memalign_int64_t(0x10,(size_t)a[1]);
              uVar15 = 0;
              if (local_260 == (int64_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              uVar8 = 0;
              if (0 < iVar11) {
                uVar8 = uVar18;
              }
              for (; alVar47[1] = lVar5, uVar8 != uVar15; uVar15 = uVar15 + 1) {
                a[1] = (int *)(ulong)(byte)_s1[uVar15];
                local_260[uVar15] = (long)matrix->mapper[(long)a[1]];
              }
              for (; alVar47[1] <= lVar5; alVar47[1] = alVar47[1] + 1) {
                local_260[alVar47[1]] = 0;
              }
            }
            else {
              local_260 = (int64_t *)0x0;
            }
            piVar12 = (int *)(uVar13 + 1);
            alVar47[1] = 0x7ffffffffffffffe - (long)iVar30;
            uVar19 = (uint)piVar12;
            uVar21 = (uint)((ulong)piVar12 >> 0x20);
            auVar22._8_4_ = uVar19;
            auVar22._0_8_ = piVar12;
            auVar22._12_4_ = uVar21;
            local_128._8_4_ = (int)alVar47[1];
            local_128._0_8_ = alVar47[1];
            local_128._12_4_ = (int)((ulong)alVar47[1] >> 0x20);
            local_f8 = auVar22 >> 0x40;
            local_c8 = open;
            uStack_c4 = 0;
            iStack_c0 = open;
            uStack_bc = 0;
            local_d8._4_4_ = 0;
            local_d8._0_4_ = gap;
            local_d8._8_4_ = gap;
            local_d8._12_4_ = 0;
            iStack_27c = iVar11 >> 0x1f;
            local_108 = iVar11;
            iStack_104 = iStack_27c;
            iStack_100 = iVar11;
            iStack_fc = iStack_27c;
            local_e8._8_4_ = s2Len;
            local_e8._0_8_ = piVar16;
            local_e8._12_4_ = 0;
            piVar6 = matrix->mapper;
            for (piVar7 = (int *)0x0; piVar16 != piVar7; piVar7 = (int *)((long)piVar7 + 1)) {
              ptr[(long)piVar7 + 1] = (long)piVar6[(byte)_s2[(long)piVar7]];
            }
            *ptr = 0;
            for (piVar6 = piVar16; (int)piVar6 <= s2Len; piVar6 = (int *)((long)piVar6 + 1)) {
              ptr[(long)piVar6 + 1] = 0;
            }
            for (piVar6 = (int *)0x0; piVar16 != piVar6; piVar6 = (int *)((long)piVar6 + 1)) {
              ptr_00[(long)piVar6 + 1] = 0;
              ptr_01[(long)piVar6 + 1] = (ulong)piVar12;
            }
            *ptr_00 = (ulong)piVar12;
            *ptr_01 = (ulong)piVar12;
            for (piVar6 = piVar16; (int)piVar6 <= s2Len; piVar6 = (int *)((long)piVar6 + 1)) {
              ptr_00[(long)piVar6 + 1] = (ulong)piVar12;
              ptr_01[(long)piVar6 + 1] = (ulong)piVar12;
            }
            local_150 = (long)piVar16 * 2;
            local_1b8._0_12_ = ZEXT812(1);
            local_1b8._12_4_ = 0;
            local_200 = 0;
            uStack_1c0 = auVar22._8_8_;
            uStack_170 = uStack_1c0;
            uStack_1a0 = uStack_1c0;
            uStack_220 = uStack_1c0;
            piVar6 = (int *)0x0;
            local_228 = piVar12;
            local_1a8 = piVar12;
            local_178 = piVar12;
            while ((long)piVar6 < lVar5) {
              if (matrix->type == 0) {
                piVar7 = (int *)local_260[(long)piVar6];
                alVar47[1] = local_260[(long)piVar6 + 1];
              }
              else {
                uVar3 = iVar11 - 1;
                if ((long)((ulong)piVar6 | 1) < lVar5) {
                  uVar3 = (uint)piVar6 | 1;
                }
                alVar47[1] = (long)(int)uVar3;
                piVar7 = piVar6;
              }
              piVar17 = matrix->matrix;
              a[1] = (int *)(long)matrix->size;
              piVar7 = piVar17 + (long)piVar7 * (long)a[1];
              local_138 = piVar17 + alVar47[1] * (long)a[1];
              alVar46[1] = (longlong)piVar7;
              alVar46[0] = (longlong)piVar17;
              a[0] = (longlong)matrix;
              ppVar14 = matrix;
              local_148 = piVar6;
              local_130 = piVar7;
              _mm_cmplt_epi64_rpl(a,alVar46);
              local_b8 = extraout_XMM0_Qa;
              uStack_b0 = extraout_XMM0_Qb;
              local_140 = ((ulong)piVar6 | 1) * (long)piVar16 + -1;
              piVar17 = (int *)0x0;
              uStack_250 = uStack_1c0;
              local_258 = (ulong)piVar12;
              local_218 = 0xffffffffffffffff;
              uStack_210 = 0;
              local_298._0_8_ = local_f8._0_8_;
              local_298._8_8_ = local_f8._8_8_;
              uVar13 = local_f8._0_8_;
              uVar15 = local_f8._8_8_;
              local_1d8 = piVar12;
              uVar18 = uStack_1c0;
              while( true ) {
                if (piVar16 < piVar17) break;
                uStack_50 = ptr_00[(long)piVar17 + 1];
                local_88._0_8_ = local_298._8_8_ - CONCAT44(uStack_c4,local_c8);
                local_88._8_8_ = uStack_50 - CONCAT44(uStack_bc,iStack_c0);
                local_78._0_8_ = CONCAT44(local_258._4_4_,(uint)uStack_250) - local_d8._0_8_;
                local_78._8_8_ = ptr_01[(long)piVar17 + 1] - local_d8._8_8_;
                auVar43._0_8_ = local_298._0_8_ - CONCAT44(uStack_c4,local_c8);
                auVar43._8_8_ = local_298._8_8_ - CONCAT44(uStack_bc,iStack_c0);
                local_68._0_8_ = (long)local_1d8 - local_d8._0_8_;
                local_68._8_8_ = uVar18 - local_d8._8_8_;
                alVar47[1] = (long)local_130[ptr[(long)piVar17 + 1]];
                auVar45._0_8_ = (long)local_138[ptr[(long)piVar17]] + uVar13;
                auVar45._8_8_ = alVar47[1] + uVar15;
                auVar22 = local_78 ^ _DAT_008a1890;
                auVar26 = local_88 ^ _DAT_008a1890;
                iVar30 = -(uint)(auVar22._0_4_ < auVar26._0_4_);
                iVar33 = -(uint)(auVar22._4_4_ < auVar26._4_4_);
                iVar34 = -(uint)(auVar22._8_4_ < auVar26._8_4_);
                iVar35 = -(uint)(auVar22._12_4_ < auVar26._12_4_);
                auVar36._4_4_ = iVar30;
                auVar36._0_4_ = iVar30;
                auVar36._8_4_ = iVar34;
                auVar36._12_4_ = iVar34;
                iVar30 = -(uint)(auVar26._4_4_ == auVar22._4_4_);
                iVar34 = -(uint)(auVar26._12_4_ == auVar22._12_4_);
                auVar28._4_4_ = iVar30;
                auVar28._0_4_ = iVar30;
                auVar28._8_4_ = iVar34;
                auVar28._12_4_ = iVar34;
                auVar27._4_4_ = iVar33;
                auVar27._0_4_ = iVar33;
                auVar27._8_4_ = iVar35;
                auVar27._12_4_ = iVar35;
                auVar27 = auVar27 | auVar28 & auVar36;
                auVar28 = ~auVar27 & local_78 | local_88 & auVar27;
                auVar22 = local_68 ^ _DAT_008a1890;
                auVar26 = auVar43 ^ _DAT_008a1890;
                iVar30 = -(uint)(auVar22._0_4_ < auVar26._0_4_);
                iVar33 = -(uint)(auVar22._4_4_ < auVar26._4_4_);
                iVar34 = -(uint)(auVar22._8_4_ < auVar26._8_4_);
                iVar35 = -(uint)(auVar22._12_4_ < auVar26._12_4_);
                auVar37._4_4_ = iVar30;
                auVar37._0_4_ = iVar30;
                auVar37._8_4_ = iVar34;
                auVar37._12_4_ = iVar34;
                iVar30 = -(uint)(auVar26._4_4_ == auVar22._4_4_);
                iVar34 = -(uint)(auVar26._12_4_ == auVar22._12_4_);
                auVar23._4_4_ = iVar30;
                auVar23._0_4_ = iVar30;
                auVar23._8_4_ = iVar34;
                auVar23._12_4_ = iVar34;
                auVar38._4_4_ = iVar33;
                auVar38._0_4_ = iVar33;
                auVar38._8_4_ = iVar35;
                auVar38._12_4_ = iVar35;
                auVar38 = auVar38 | auVar23 & auVar37;
                local_98 = ~auVar38 & local_68 | auVar43 & auVar38;
                auVar22 = auVar45 ^ _DAT_008a1890;
                iVar30 = -(uint)((int)DAT_008a1890 < auVar22._0_4_);
                iVar34 = -(uint)(DAT_008a1890._4_4_ < auVar22._4_4_);
                iVar33 = -(uint)(DAT_008a1890._8_4_ < auVar22._8_4_);
                iVar35 = -(uint)(DAT_008a1890._12_4_ < auVar22._12_4_);
                auVar31._4_4_ = iVar30;
                auVar31._0_4_ = iVar30;
                auVar31._8_4_ = iVar33;
                auVar31._12_4_ = iVar33;
                auVar24._4_4_ = -(uint)(auVar22._4_4_ == DAT_008a1890._4_4_);
                auVar24._12_4_ = -(uint)(auVar22._12_4_ == DAT_008a1890._12_4_);
                auVar24._0_4_ = auVar24._4_4_;
                auVar24._8_4_ = auVar24._12_4_;
                auVar44._4_4_ = iVar34;
                auVar44._0_4_ = iVar34;
                auVar44._8_4_ = iVar35;
                auVar44._12_4_ = iVar35;
                auVar45 = (auVar44 | auVar24 & auVar31) & auVar45;
                auVar22 = local_98 ^ _DAT_008a1890;
                auVar26 = auVar45 ^ _DAT_008a1890;
                iVar30 = -(uint)(auVar22._0_4_ < auVar26._0_4_);
                iVar33 = -(uint)(auVar22._4_4_ < auVar26._4_4_);
                iVar34 = -(uint)(auVar22._8_4_ < auVar26._8_4_);
                iVar35 = -(uint)(auVar22._12_4_ < auVar26._12_4_);
                auVar32._4_4_ = iVar30;
                auVar32._0_4_ = iVar30;
                auVar32._8_4_ = iVar34;
                auVar32._12_4_ = iVar34;
                iVar30 = -(uint)(auVar26._4_4_ == auVar22._4_4_);
                iVar34 = -(uint)(auVar26._12_4_ == auVar22._12_4_);
                auVar26._4_4_ = iVar30;
                auVar26._0_4_ = iVar30;
                auVar26._8_4_ = iVar34;
                auVar26._12_4_ = iVar34;
                auVar25._4_4_ = iVar33;
                auVar25._0_4_ = iVar33;
                auVar25._8_4_ = iVar35;
                auVar25._12_4_ = iVar35;
                auVar25 = auVar25 | auVar26 & auVar32;
                auVar45 = ~auVar25 & local_98 | auVar45 & auVar25;
                auVar22 = auVar45 ^ _DAT_008a1890;
                auVar26 = auVar28 ^ _DAT_008a1890;
                iVar30 = -(uint)(auVar26._0_4_ < auVar22._0_4_);
                iVar33 = -(uint)(auVar26._4_4_ < auVar22._4_4_);
                iVar34 = -(uint)(auVar26._8_4_ < auVar22._8_4_);
                iVar35 = -(uint)(auVar26._12_4_ < auVar22._12_4_);
                auVar39._4_4_ = iVar30;
                auVar39._0_4_ = iVar30;
                auVar39._8_4_ = iVar34;
                auVar39._12_4_ = iVar34;
                iVar30 = -(uint)(auVar26._4_4_ == auVar22._4_4_);
                iVar34 = -(uint)(auVar26._12_4_ == auVar22._12_4_);
                auVar20._4_4_ = iVar30;
                auVar20._0_4_ = iVar30;
                auVar20._8_4_ = iVar34;
                auVar20._12_4_ = iVar34;
                auVar29._4_4_ = iVar33;
                auVar29._0_4_ = iVar33;
                auVar29._8_4_ = iVar35;
                auVar29._12_4_ = iVar35;
                auVar29 = auVar29 | auVar20 & auVar39;
                auVar22 = ~auVar29 & auVar28 | auVar45 & auVar29;
                alVar47[0] = (longlong)local_138;
                a_00[1] = (longlong)a[1];
                a_00[0] = (longlong)ppVar14;
                local_58 = local_298._8_8_;
                alVar46 = _mm_cmpeq_epi64_rpl(a_00,alVar47);
                b[0] = alVar46[1];
                local_258._0_4_ = auVar22._0_4_;
                local_258._4_4_ = auVar22._4_4_;
                uStack_250._0_4_ = auVar22._8_4_;
                uStack_250._4_4_ = auVar22._12_4_;
                uVar3 = ~extraout_XMM0_Da & (uint)local_258;
                uVar40 = ~extraout_XMM0_Db & local_258._4_4_;
                uVar41 = ~extraout_XMM0_Dc & (uint)uStack_250;
                uVar42 = ~extraout_XMM0_Dd & uStack_250._4_4_;
                local_298._0_4_ = auVar28._0_4_;
                local_298._4_4_ = auVar28._4_4_;
                local_298._8_4_ = auVar28._8_4_;
                local_298._12_4_ = auVar28._12_4_;
                local_a8 = extraout_XMM0_Da & uVar19;
                uStack_a4 = extraout_XMM0_Db & uVar21;
                uStack_a0 = extraout_XMM0_Dc & uVar19;
                uStack_9c = extraout_XMM0_Dd & uVar21;
                local_258 = CONCAT44(~extraout_XMM0_Db & local_298._4_4_ | uStack_a4,
                                     ~extraout_XMM0_Da & local_298._0_4_ | local_a8);
                uStack_250._0_4_ = ~extraout_XMM0_Dc & local_298._8_4_ | uStack_a0;
                uStack_250._4_4_ = ~extraout_XMM0_Dd & local_298._12_4_ | uStack_9c;
                local_298._4_4_ = uVar40;
                local_298._0_4_ = uVar3;
                local_298._8_4_ = uVar41;
                local_298._12_4_ = uVar42;
                b[1] = alVar47[1];
                a_01[1] = (longlong)a[1];
                a_01[0] = (longlong)ppVar14;
                alVar46 = _mm_cmpeq_epi64_rpl(a_01,b);
                b_00[0] = alVar46[1];
                b_00[1] = alVar47[1];
                a_02[1] = (longlong)a[1];
                a_02[0] = (longlong)ppVar14;
                alVar46 = _mm_cmpeq_epi64_rpl(a_02,b_00);
                b_01[0] = alVar46[1];
                b_01[1] = alVar47[1];
                a_03[1] = (longlong)a[1];
                a_03[0] = (longlong)ppVar14;
                alVar46 = _mm_cmpeq_epi64_rpl(a_03,b_01);
                b_02[0] = alVar46[1];
                b_02[1] = alVar47[1];
                a_04[1] = (longlong)a[1];
                a_04[0] = (longlong)ppVar14;
                alVar46 = _mm_cmpgt_epi64_rpl(a_04,b_02);
                b_03[0] = alVar46[1];
                b_03[1] = alVar47[1];
                a_05[1] = (longlong)a[1];
                a_05[0] = (longlong)ppVar14;
                alVar46 = _mm_cmpgt_epi64_rpl(a_05,b_03);
                lVar10 = alVar46[1];
                uVar3 = (extraout_XMM0_Da_04 & 0x60 |
                         extraout_XMM0_Da_03 & 0x18 | ~extraout_XMM0_Da_00 & extraout_XMM0_Da_01 & 4
                        | ~extraout_XMM0_Da_01 & (extraout_XMM0_Da_02 & 3 ^ 1)) ^ 0x50;
                piVar1 = ((ppVar4->field_4).rowcols)->score_row;
                if (piVar17 < piVar16) {
                  alVar47[1] = 0;
                  lVar10 = local_200 + (long)piVar1;
                  *(byte *)((long)piVar17 + lVar10) =
                       (extraout_XMM0_Bi_03 & 0x60 |
                        extraout_XMM0_Bi_02 & 0x18 | ~extraout_XMM0_Bi & extraout_XMM0_Bi_00 & 4 |
                       ~extraout_XMM0_Bi_00 & (extraout_XMM0_Bi_01 & 3 ^ 1)) ^ 0x50;
                }
                bVar2 = lVar5 <= (long)((ulong)piVar6 | 1);
                piVar7 = (int *)CONCAT71((int7)((ulong)alVar47[1] >> 8),bVar2);
                b_04[0]._1_7_ = (undefined7)((ulong)lVar10 >> 8);
                b_04[0]._0_1_ = piVar17 == (int *)0x0 || bVar2;
                if (piVar17 != (int *)0x0 && !bVar2) {
                  piVar7 = (int *)(ulong)uVar3;
                  *(char *)((long)piVar17 + (long)piVar1 + local_140) = (char)uVar3;
                }
                uVar3 = ~extraout_XMM0_Dc & local_98._8_4_ | uStack_a0;
                uVar40 = ~extraout_XMM0_Dd & local_98._12_4_ | uStack_9c;
                local_1d8 = (int *)CONCAT44(~extraout_XMM0_Db & local_98._4_4_ | uStack_a4,
                                            ~extraout_XMM0_Da & local_98._0_4_ | local_a8);
                ptr_00[(long)piVar17] = local_298._0_8_;
                ptr_01[(long)piVar17] = local_258;
                b_04[1] = (longlong)piVar7;
                a_06[1] = (longlong)a[1];
                a_06[0] = (longlong)ppVar14;
                alVar47 = _mm_cmpgt_epi64_rpl(a_06,b_04);
                b_05[0] = alVar47[1];
                b_05[1] = (longlong)piVar7;
                a_07[1] = (longlong)a[1];
                a_07[0] = (longlong)ppVar14;
                alVar47 = _mm_cmplt_epi64_rpl(a_07,b_05);
                b_06[0] = alVar47[1];
                local_278._0_4_ = (uint)extraout_XMM0_Qa_00;
                local_278._4_4_ = (uint)((ulong)extraout_XMM0_Qa_00 >> 0x20);
                uStack_270._0_4_ = (uint)extraout_XMM0_Qb_00;
                uStack_270._4_4_ = (uint)((ulong)extraout_XMM0_Qb_00 >> 0x20);
                local_278._0_4_ = extraout_XMM0_Da_05 & (uint)local_b8 & (uint)local_278;
                local_278._4_4_ = extraout_XMM0_Db_00 & local_b8._4_4_ & local_278._4_4_;
                uStack_270._0_4_ = extraout_XMM0_Dc_00 & (uint)uStack_b0 & (uint)uStack_270;
                uStack_270._4_4_ = extraout_XMM0_Dd_00 & uStack_b0._4_4_ & uStack_270._4_4_;
                b_06[1] = (longlong)piVar7;
                a_08[1] = (longlong)a[1];
                a_08[0] = (longlong)ppVar14;
                alVar47 = _mm_cmpeq_epi64_rpl(a_08,b_06);
                b_07[0] = alVar47[1];
                b_07[1] = (longlong)piVar7;
                a_09[1] = (longlong)a[1];
                a_09[0] = (longlong)ppVar14;
                alVar47 = _mm_cmpgt_epi64_rpl(a_09,b_07);
                b_08[0] = alVar47[1];
                local_1f8 = CONCAT44(extraout_XMM0_Db_01 & local_278._4_4_,
                                     extraout_XMM0_Da_06 & (uint)local_278);
                uStack_1f0._0_4_ = extraout_XMM0_Dc_01 & (uint)uStack_270;
                uStack_1f0._4_4_ = extraout_XMM0_Dd_01 & uStack_270._4_4_;
                b_08[1] = (longlong)piVar7;
                a_10[1] = (longlong)a[1];
                a_10[0] = (longlong)ppVar14;
                _mm_cmplt_epi64_rpl(a_10,b_08);
                local_228 = (int *)(local_1f8 & local_298._0_8_ | ~local_1f8 & (ulong)local_228);
                uStack_220 = uStack_1f0 & local_298._8_8_ | ~uStack_1f0 & uStack_220;
                uVar18 = extraout_XMM0_Qa_02 & local_278 & extraout_XMM0_Qa_01;
                uVar13 = extraout_XMM0_Qb_02 & uStack_270 & extraout_XMM0_Qb_01;
                local_178 = (int *)(uVar18 & local_1b8._0_8_ |
                                   ~uVar18 & (local_1f8 & local_1b8._0_8_ |
                                             ~local_1f8 & (ulong)local_178));
                uStack_170 = uVar13 & local_1b8._8_8_ |
                             ~uVar13 & (uStack_1f0 & local_1b8._8_8_ | ~uStack_1f0 & uStack_170);
                local_1a8 = (int *)(uVar18 & local_218 |
                                   ~uVar18 & (local_1f8 & local_218 | ~local_1f8 & (ulong)local_1a8)
                                   );
                uStack_1a0 = uVar13 & uStack_210 |
                             ~uVar13 & (uStack_1f0 & uStack_210 | ~uStack_1f0 & uStack_1a0);
                local_218 = local_218 + 1;
                uStack_210 = uStack_210 + 1;
                piVar17 = (int *)((long)piVar17 + 1);
                uVar18 = CONCAT44(uVar40,uVar3);
                uVar13 = local_58;
                uVar15 = uStack_50;
              }
              local_1b8._8_8_ = local_1b8._8_8_ + 2;
              local_1b8._0_8_ = local_1b8._0_8_ + 2;
              local_200 = local_200 + local_150;
              piVar6 = (int *)((long)local_148 + 2);
            }
            local_48 = local_228;
            uStack_40 = uStack_220;
            local_118 = local_1a8;
            uStack_110 = uStack_1a0;
            local_168 = local_178;
            uStack_160 = uStack_170;
            iVar11 = 0;
            iVar30 = 0;
            for (lVar5 = 0; (int)lVar5 != 2; lVar5 = lVar5 + 1) {
              piVar16 = (&local_48)[lVar5];
              if ((long)piVar12 < (long)piVar16) {
                iVar30 = *(int *)(&local_168 + lVar5);
                piVar12 = piVar16;
                iVar11 = *(int *)(&local_118 + lVar5);
              }
              else if (piVar16 == piVar12) {
                piVar6 = (&local_118)[lVar5];
                if ((long)piVar6 < (long)iVar11) {
                  iVar30 = *(int *)(&local_168 + lVar5);
                  iVar11 = (int)piVar6;
                }
                else if ((piVar6 == (int *)(long)iVar11) &&
                        (a[1] = (&local_168)[lVar5], (long)a[1] < (long)iVar30)) {
                  iVar30 = (int)a[1];
                  iVar11 = (int)piVar6;
                }
              }
              piVar7 = piVar12;
            }
            b_09[1] = (longlong)piVar7;
            b_09[0] = (longlong)piVar6;
            a_11[1] = (longlong)a[1];
            a_11[0] = (longlong)matrix;
            ppVar14 = matrix;
            alVar47 = _mm_cmplt_epi64_rpl(a_11,b_09);
            b_10[0] = alVar47[1];
            local_298._8_8_ = extraout_XMM0_Qb_03;
            local_298._0_8_ = extraout_XMM0_Qa_03;
            b_10[1] = (longlong)piVar7;
            a_12[1] = (longlong)a[1];
            a_12[0] = (longlong)ppVar14;
            _mm_cmpgt_epi64_rpl(a_12,b_10);
            local_298 = extraout_XMM0 | local_298;
            if ((((((((((((((((local_298 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (local_298 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (local_298 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (local_298 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (local_298 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (local_298 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (local_298 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (local_298 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (local_298 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (local_298 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (local_298 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (local_298 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (local_298 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (local_298 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (local_298 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                local_298[0xf] < '\0') {
              *(byte *)&ppVar4->flag = (byte)ppVar4->flag | 0x40;
              piVar12 = (int *)0x0;
              iVar11 = 0;
              iVar30 = 0;
            }
            ppVar4->score = (int)piVar12;
            ppVar4->end_query = iVar30;
            ppVar4->end_ref = iVar11;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(local_260);
              return ppVar4;
            }
            return ppVar4;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar9 = "_s1";
      }
      else {
        uVar18 = (ulong)(uint)_s1Len;
        if (0 < _s1Len) goto LAB_005fe81b;
        __format = "%s: %s must be > 0\n";
        pcVar9 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_trace_diag_sse2_128_64",pcVar9);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;
    __m128i vTDiag;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTZero;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }
        
    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vTDiag = _mm_set1_epi64x_rpl(PARASAIL_DIAG);
    vTIns = _mm_set1_epi64x_rpl(PARASAIL_INS);
    vTDel = _mm_set1_epi64x_rpl(PARASAIL_DEL);
    vTZero = _mm_set1_epi64x_rpl(PARASAIL_ZERO);
    vTDiagE = _mm_set1_epi64x_rpl(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi64x_rpl(PARASAIL_INS_E);
    vTDiagF = _mm_set1_epi64x_rpl(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi64x_rpl(PARASAIL_DEL_F);

    /* initialize result */
    result = parasail_result_new_trace(s1Len, s2Len, 16, sizeof(int8_t));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vF = vNegInf;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vNWH = _mm_max_epi64_rpl(vNWH, vZero);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64_rpl(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
            /* trace table */
            {
                __m128i cond_zero = _mm_cmpeq_epi64_rpl(vWH, vZero);
                __m128i case1 = _mm_cmpeq_epi64_rpl(vWH, vNWH);
                __m128i case2 = _mm_cmpeq_epi64_rpl(vWH, vF);
                __m128i vT = _mm_blendv_epi8_rpl(
                        _mm_blendv_epi8_rpl(vTIns, vTDel, case2),
                        _mm_blendv_epi8_rpl(vTDiag, vTZero, cond_zero),
                        case1);
                __m128i condE = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
                __m128i condF = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
                __m128i vET = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, condE);
                __m128i vFT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, condF);
                vT = _mm_or_si128(vT, vET);
                vT = _mm_or_si128(vT, vFT);
                arr_store_si128(result->trace->trace_table, vT, i, s1Len, j, s2Len);
            }
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi64_rpl(vJ, vNegOne),
                        _mm_cmplt_epi64_rpl(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi64_rpl(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}